

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::visitIncExpr(CheckerVisitor *this,IncExpr *expr)

{
  SQChar *pSVar1;
  ValueRef *pVVar2;
  IncExpr *in_RSI;
  Visitor *in_RDI;
  ValueRef *v;
  SQChar *name;
  SQChar buffer [64];
  IncExpr *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffffa0;
  SQChar *in_stack_ffffffffffffffa8;
  Expr *in_stack_ffffffffffffffb0;
  CheckerVisitor *in_stack_ffffffffffffffb8;
  FunctionDecl *in_stack_ffffffffffffffc0;
  SQChar *in_stack_ffffffffffffffc8;
  FunctionInfo *in_stack_ffffffffffffffd0;
  
  memset(&stack0xffffffffffffffa8,0,0x40);
  IncExpr::argument(in_RSI);
  deparen((Expr *)in_stack_ffffffffffffff88);
  pSVar1 = computeNameRef(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if ((pSVar1 != (SQChar *)0x0) &&
     (pVVar2 = findValueInScopes(in_stack_ffffffffffffffb8,(SQChar *)in_stack_ffffffffffffffb0),
     pVVar2 != (ValueRef *)0x0)) {
    if (in_RDI[0x2a]._vptr_Visitor != (_func_int **)0x0) {
      FunctionInfo::addModifiable
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    }
    pVVar2->expression = (Expr *)0x0;
    pVVar2->state = VRS_MULTIPLE;
    pVVar2->flagsPositive = 0;
    pVVar2->flagsNegative = 0;
    (pVVar2->upperBound).kind = VBK_UNKNOWN;
    (pVVar2->lowerBound).kind = VBK_UNKNOWN;
  }
  Visitor::visitIncExpr(in_RDI,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void CheckerVisitor::visitIncExpr(IncExpr *expr) {

  SQChar buffer[64] = { 0 };
  const SQChar *name = computeNameRef(deparen(expr->argument()), buffer, sizeof buffer);
  if (name) {
    ValueRef *v = findValueInScopes(name);

    if (v) {
      if (currentInfo) {
        currentInfo->addModifiable(name, v->info->ownedScope->owner);
      }

      v->expression = nullptr;
      v->state = VRS_MULTIPLE;
      v->flagsNegative = v->flagsPositive = 0;
      v->lowerBound.kind = v->upperBound.kind = VBK_UNKNOWN;
    }
  }

  Visitor::visitIncExpr(expr);
}